

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleValue.cpp
# Opt level: O1

void __thiscall bubbleJson::BubbleValue::MemoryFreeValue(BubbleValue *this)

{
  ValueTypes VVar1;
  char *__ptr;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  void *pvVar4;
  ulong uVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *this_00;
  long lVar6;
  
  __ptr = (this->u).string.literal;
  VVar1 = this->type;
  if (VVar1 == ValueType_String) {
    free(__ptr);
  }
  else {
    if (VVar1 == ValueType_Object) {
      for (p_Var3 = *(_Rb_tree_node_base **)(__ptr + 0x18);
          p_Var3 != (_Rb_tree_node_base *)(__ptr + 8);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        MemoryFreeValue((BubbleValue *)(p_Var3 + 2));
      }
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                 *)(this->u).string.literal;
      if (this_00 ==
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
           *)0x0) goto LAB_001101bc;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
      ::~_Rb_tree(this_00);
    }
    else {
      if (VVar1 != ValueType_Array) goto LAB_001101c3;
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                 *)(this->u).string.literal;
      pvVar4 = *(void **)&this_00->_M_impl;
      if (*(void **)&(this_00->_M_impl).super__Rb_tree_header._M_header != pvVar4) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          MemoryFreeValue((BubbleValue *)((long)pvVar4 + lVar6));
          uVar5 = uVar5 + 1;
          this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                     *)(this->u).string.literal;
          pvVar4 = *(void **)&this_00->_M_impl;
          uVar2 = (*(long *)&(this_00->_M_impl).super__Rb_tree_header._M_header - (long)pvVar4 >> 3)
                  * -0x5555555555555555;
          lVar6 = lVar6 + 0x18;
        } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
      }
      if (pvVar4 != (void *)0x0) {
        ::operator_delete(pvVar4);
      }
    }
    ::operator_delete(this_00);
  }
LAB_001101bc:
  (this->u).number = 0.0;
LAB_001101c3:
  this->type = ValueType_Null;
  return;
}

Assistant:

void BubbleValue::MemoryFreeValue()
{
    auto members = this->u.object.members;
    switch (this->type)
    {
        case ValueType_String:
            free(this->u.string.literal);
            this->u.string.literal = nullptr;
            break;
        case ValueType_Array:
            for (int i = 0; i < this->u.array.elements->size(); ++i)
            {
                this->u.array.elements->at(i).MemoryFreeValue();
            }
            delete this->u.array.elements;
            this->u.array.elements = nullptr;
            break;
        case ValueType_Object:
            for (auto it = members->begin(); it != members->end(); ++it)
            {
                it->second.MemoryFreeValue();
            }
            delete this->u.object.members;
            this->u.object.members = nullptr;
            break;
        default:
            break;
    }

    this->type = ValueType_Null;
}